

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O3

void av1_accumulate_stats(FIRSTPASS_STATS *section,FIRSTPASS_STATS *frame)

{
  double dVar1;
  
  dVar1 = frame->weight;
  section->frame = section->frame + frame->frame;
  section->weight = section->weight + dVar1;
  section->intra_error = frame->intra_error + section->intra_error;
  dVar1 = log1p(frame->intra_error);
  section->log_intra_error = dVar1 + section->log_intra_error;
  dVar1 = log1p(frame->coded_error);
  section->log_coded_error = dVar1 + section->log_coded_error;
  dVar1 = frame->coded_error;
  section->frame_avg_wavelet_energy =
       section->frame_avg_wavelet_energy + frame->frame_avg_wavelet_energy;
  section->coded_error = section->coded_error + dVar1;
  dVar1 = frame->pcnt_inter;
  section->sr_coded_error = frame->sr_coded_error + section->sr_coded_error;
  section->pcnt_inter = dVar1 + section->pcnt_inter;
  dVar1 = frame->pcnt_second_ref;
  section->pcnt_motion = frame->pcnt_motion + section->pcnt_motion;
  section->pcnt_second_ref = dVar1 + section->pcnt_second_ref;
  dVar1 = frame->intra_skip_pct;
  section->pcnt_neutral = frame->pcnt_neutral + section->pcnt_neutral;
  section->intra_skip_pct = dVar1 + section->intra_skip_pct;
  dVar1 = frame->inactive_zone_cols;
  section->inactive_zone_rows = section->inactive_zone_rows + frame->inactive_zone_rows;
  section->inactive_zone_cols = section->inactive_zone_cols + dVar1;
  dVar1 = frame->mvr_abs;
  section->MVr = section->MVr + frame->MVr;
  section->mvr_abs = section->mvr_abs + dVar1;
  dVar1 = frame->mvc_abs;
  section->MVc = section->MVc + frame->MVc;
  section->mvc_abs = section->mvc_abs + dVar1;
  dVar1 = frame->MVcv;
  section->MVrv = section->MVrv + frame->MVrv;
  section->MVcv = section->MVcv + dVar1;
  dVar1 = frame->new_mv_count;
  section->mv_in_out_count = section->mv_in_out_count + frame->mv_in_out_count;
  section->new_mv_count = section->new_mv_count + dVar1;
  dVar1 = frame->count;
  section->duration = section->duration + frame->duration;
  section->count = section->count + dVar1;
  return;
}

Assistant:

void av1_accumulate_stats(FIRSTPASS_STATS *section,
                          const FIRSTPASS_STATS *frame) {
  section->frame += frame->frame;
  section->weight += frame->weight;
  section->intra_error += frame->intra_error;
  section->log_intra_error += log1p(frame->intra_error);
  section->log_coded_error += log1p(frame->coded_error);
  section->frame_avg_wavelet_energy += frame->frame_avg_wavelet_energy;
  section->coded_error += frame->coded_error;
  section->sr_coded_error += frame->sr_coded_error;
  section->pcnt_inter += frame->pcnt_inter;
  section->pcnt_motion += frame->pcnt_motion;
  section->pcnt_second_ref += frame->pcnt_second_ref;
  section->pcnt_neutral += frame->pcnt_neutral;
  section->intra_skip_pct += frame->intra_skip_pct;
  section->inactive_zone_rows += frame->inactive_zone_rows;
  section->inactive_zone_cols += frame->inactive_zone_cols;
  section->MVr += frame->MVr;
  section->mvr_abs += frame->mvr_abs;
  section->MVc += frame->MVc;
  section->mvc_abs += frame->mvc_abs;
  section->MVrv += frame->MVrv;
  section->MVcv += frame->MVcv;
  section->mv_in_out_count += frame->mv_in_out_count;
  section->new_mv_count += frame->new_mv_count;
  section->count += frame->count;
  section->duration += frame->duration;
}